

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VROffAxisProjectionNode.cpp
# Opt level: O0

void __thiscall
MinVR::VROffAxisProjectionNode::render
          (VROffAxisProjectionNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  VRAnyCoreType t_00;
  float *pfVar1;
  VRMatrix4 *m1;
  VRDataIndex *this_00;
  char *in_RSI;
  long in_RDI;
  float fVar2;
  VRMatrix4 viewMat;
  VRMatrix4 Mtrans;
  VRMatrix4 Mrot;
  VRMatrix4 projMat;
  float t;
  float b;
  float r;
  float l;
  float d;
  VRVector3 vc;
  VRVector3 vb;
  VRVector3 va;
  VRVector3 vn;
  VRVector3 vu;
  VRVector3 vr;
  VRPoint3 pe;
  VRMatrix4 cameraMatrix;
  VRPoint3 pc;
  VRPoint3 pb;
  VRPoint3 pa;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  float in_stack_fffffffffffffab0;
  float r1c3;
  float in_stack_fffffffffffffab4;
  float in_stack_fffffffffffffab8;
  float yy;
  float in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffae4;
  char *in_stack_fffffffffffffae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  VRVector3 *in_stack_fffffffffffffaf8;
  VRVector3 *v;
  float in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  float fVar7;
  VRDataIndex *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  float in_stack_fffffffffffffb20;
  float r3c2;
  float in_stack_fffffffffffffb30;
  float r3c4;
  float in_stack_fffffffffffffb40;
  float r4c2;
  float in_stack_fffffffffffffb50;
  float r4c4;
  undefined1 local_421 [33];
  string local_400 [32];
  VRMatrix4 local_3e0;
  VRPoint3 local_398;
  VRVector3 local_380;
  VRMatrix4 local_368;
  undefined1 in_stack_fffffffffffffd07;
  string *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffd10;
  VRDataIndex *in_stack_fffffffffffffd18;
  allocator<char> local_2d1;
  string local_2d0 [32];
  string local_2b0 [32];
  VRMatrix4 local_290;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  VRVector3 local_230;
  VRVector3 local_218;
  VRVector3 local_200;
  VRVector3 local_1e8;
  VRVector3 local_1d0;
  VRVector3 local_1b8;
  VRVector3 local_1a0;
  VRVector3 local_188;
  VRVector3 local_170;
  VRVector3 local_158;
  VRPoint3 local_140;
  VRPoint3 local_128;
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [32];
  VRDatum_conflict *local_c0;
  VRMatrix4 local_b8;
  VRPoint3 local_70;
  VRPoint3 local_48;
  VRPoint3 local_30;
  char *local_10;
  
  v = (VRVector3 *)&stack0xfffffffffffffaa8;
  local_10 = in_RSI;
  VRDataIndex::pushState
            ((VRDataIndex *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  VRPoint3::VRPoint3((VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     (VRPoint3 *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  VRPoint3::VRPoint3((VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     (VRPoint3 *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  VRPoint3::VRPoint3((VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     (VRPoint3 *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  local_c0 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                        in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07);
  t_00.datum._4_4_ = in_stack_fffffffffffffad4;
  t_00.datum._0_4_ = in_stack_fffffffffffffad0;
  VRMatrix4::VRMatrix4
            ((VRMatrix4 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),t_00);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  VRPoint3::VRPoint3((VRPoint3 *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                     in_stack_fffffffffffffabc,in_stack_fffffffffffffab8,in_stack_fffffffffffffab4);
  VRMatrix4::getColumn
            ((VRMatrix4 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
             (int)in_stack_fffffffffffffab4);
  MinVR::operator+((VRPoint3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (VRVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  VRVector3::~VRVector3(&local_158);
  VRPoint3::~VRPoint3(&local_140);
  MinVR::operator-((VRPoint3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  VRVector3::normalize((VRVector3 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  VRVector3::~VRVector3(&local_188);
  MinVR::operator-((VRPoint3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  VRVector3::normalize((VRVector3 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  VRVector3::~VRVector3(&local_1b8);
  VRVector3::cross(in_stack_fffffffffffffaf8,(VRVector3 *)in_stack_fffffffffffffaf0);
  VRVector3::normalize((VRVector3 *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  VRVector3::~VRVector3(&local_1e8);
  MinVR::operator-((VRPoint3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  MinVR::operator-((VRPoint3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  MinVR::operator-((VRPoint3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  local_234 = VRVector3::dot((VRVector3 *)
                             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                             (VRVector3 *)
                             CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  local_234 = -local_234;
  fVar2 = VRVector3::dot((VRVector3 *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                         (VRVector3 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8))
  ;
  local_238 = (fVar2 * *(float *)(in_RDI + 0xd0)) / local_234;
  fVar2 = VRVector3::dot((VRVector3 *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                         (VRVector3 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8))
  ;
  local_23c = (fVar2 * *(float *)(in_RDI + 0xd0)) / local_234;
  fVar2 = VRVector3::dot((VRVector3 *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                         (VRVector3 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8))
  ;
  local_240 = (fVar2 * *(float *)(in_RDI + 0xd0)) / local_234;
  fVar2 = VRVector3::dot((VRVector3 *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                         (VRVector3 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8))
  ;
  local_244 = (fVar2 * *(float *)(in_RDI + 0xd0)) / local_234;
  VRMatrix4::projection
            ((float)((ulong)in_stack_fffffffffffffaf8 >> 0x20),SUB84(in_stack_fffffffffffffaf8,0),
             (float)((ulong)in_stack_fffffffffffffaf0 >> 0x20),SUB84(in_stack_fffffffffffffaf0,0),
             (float)((ulong)in_stack_fffffffffffffae8 >> 0x20),SUB84(in_stack_fffffffffffffae8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  VRDataIndex::addData
            (in_stack_fffffffffffffb08,
             (string *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             &in_stack_fffffffffffffaf8->super_VRFloatArrayConvertible);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  VRVector3::operator[](&local_170,0);
  VRVector3::operator[](&local_170,1);
  VRVector3::operator[](&local_170,2);
  pfVar1 = VRVector3::operator[](&local_1a0,0);
  r4c4 = SUB84(pfVar1,0);
  pfVar1 = VRVector3::operator[](&local_1a0,1);
  r4c2 = SUB84(pfVar1,0);
  pfVar1 = VRVector3::operator[](&local_1a0,2);
  r3c4 = SUB84(pfVar1,0);
  pfVar1 = VRVector3::operator[](&local_1d0,0);
  fVar2 = *pfVar1;
  m1 = (VRMatrix4 *)VRVector3::operator[](&local_1d0,1);
  r3c2 = SUB84(pfVar1,0);
  r1c3 = *(float *)&(m1->super_VRFloatArrayConvertible)._vptr_VRFloatArrayConvertible;
  this_00 = (VRDataIndex *)VRVector3::operator[](&local_1d0,2);
  yy = *(float *)&(this_00->_theIndex)._M_t._M_impl;
  uVar6 = 0x3f800000;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  fVar7 = r1c3;
  VRMatrix4::fromRowMajorElements
            ((float)((ulong)this_00 >> 0x20),SUB84(this_00,0),r1c3,in_stack_fffffffffffffb00,
             (float)((ulong)&stack0xfffffffffffffaa8 >> 0x20),SUB84(&stack0xfffffffffffffaa8,0),
             (float)((ulong)in_stack_fffffffffffffaf0 >> 0x20),SUB84(in_stack_fffffffffffffaf0,0),
             in_stack_fffffffffffffb20,r3c2,in_stack_fffffffffffffb30,r3c4,in_stack_fffffffffffffb40
             ,r4c2,in_stack_fffffffffffffb50,r4c4);
  VRPoint3::VRPoint3((VRPoint3 *)CONCAT44(in_stack_fffffffffffffac4,uVar3),in_stack_fffffffffffffabc
                     ,yy,in_stack_fffffffffffffab4);
  MinVR::operator-((VRPoint3 *)CONCAT44(in_stack_fffffffffffffabc,yy),
                   (VRPoint3 *)CONCAT44(in_stack_fffffffffffffab4,r1c3));
  VRMatrix4::translation(v);
  VRVector3::~VRVector3(&local_380);
  VRPoint3::~VRPoint3(&local_398);
  MinVR::operator*(m1,(VRMatrix4 *)CONCAT44(fVar2,in_stack_fffffffffffffb10));
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_421;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,local_10,(allocator<char> *)CONCAT44(in_stack_fffffffffffffae4,uVar6));
  VRDataIndex::addData
            (this_00,(string *)CONCAT44(fVar7,in_stack_fffffffffffffb00),
             &v->super_VRFloatArrayConvertible);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string((string *)(local_421 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_421);
  VRDisplayNode::render
            ((VRDisplayNode *)CONCAT44(in_stack_fffffffffffffad4,uVar5),
             (VRDataIndex *)CONCAT44(in_stack_fffffffffffffacc,uVar4),
             (VRRenderHandler *)CONCAT44(in_stack_fffffffffffffac4,uVar3));
  VRDataIndex::popState((VRDataIndex *)CONCAT44(in_stack_fffffffffffffad4,uVar5));
  VRMatrix4::~VRMatrix4(&local_3e0);
  VRMatrix4::~VRMatrix4(&local_368);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffffce0);
  VRMatrix4::~VRMatrix4(&local_290);
  VRVector3::~VRVector3(&local_230);
  VRVector3::~VRVector3(&local_218);
  VRVector3::~VRVector3(&local_200);
  VRVector3::~VRVector3(&local_1d0);
  VRVector3::~VRVector3(&local_1a0);
  VRVector3::~VRVector3(&local_170);
  VRPoint3::~VRPoint3(&local_128);
  VRMatrix4::~VRMatrix4(&local_b8);
  VRPoint3::~VRPoint3(&local_70);
  VRPoint3::~VRPoint3(&local_48);
  VRPoint3::~VRPoint3(&local_30);
  return;
}

Assistant:

void
VROffAxisProjectionNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
	renderState->pushState();

	// This projection code follows the math described in this paper:
	// http://csc.lsu.edu/~kooima/pdfs/gen-perspective.pdf

	VRPoint3 pa = _botLeft;
	VRPoint3 pb = _botRight;
	VRPoint3 pc = _topLeft;
  VRMatrix4 cameraMatrix = renderState->getValue("CameraMatrix");
  VRPoint3 pe = VRPoint3(0,0,0) + cameraMatrix.getColumn(3);

	// Compute an orthonormal basis for the screen
	VRVector3 vr = (pb - pa).normalize();
	VRVector3 vu = (pc - pa).normalize();
	VRVector3 vn = vr.cross(vu).normalize();

	// Compute the screen corner vectors
	VRVector3 va = pa - pe;
	VRVector3 vb = pb - pe;
	VRVector3 vc = pc - pe;

	// Find the distance from the eye to screen plane
	float d = -va.dot(vn);

	// Find the extent of the perpendicular projection
	float l = vr.dot(va) * _nearClip / d;
	float r = vr.dot(vb) * _nearClip / d;
	float b = vu.dot(va) * _nearClip / d;
	float t = vu.dot(vc) * _nearClip / d;

	VRMatrix4 projMat = VRMatrix4::projection(l, r, b, t, _nearClip, _farClip);

	renderState->addData("ProjectionMatrix", projMat);

	// Rotate the projection to be non-perpendicular
    VRMatrix4 Mrot = VRMatrix4::fromRowMajorElements(vr[0], vr[1], vr[2], 0.0,
                                                     vu[0], vu[1], vu[2], 0.0,
                                                     vn[0], vn[1], vn[2], 0.0,
                                                     0.0, 0.0, 0.0, 1.0);

	// Move the apex of the frustum to the origin
	VRMatrix4 Mtrans = VRMatrix4::translation(VRPoint3(0, 0, 0) - pe);

	VRMatrix4 viewMat = Mrot * Mtrans;

	renderState->addData("ViewMatrix", viewMat);

	VRDisplayNode::render(renderState, renderHandler);

	renderState->popState();
}